

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O0

char * __thiscall
google::protobuf::internal::ExtensionSet::ParseMessageSet<google::protobuf::Message>
          (ExtensionSet *this,char *ptr,Message *extendee,InternalMetadata *metadata,
          ParseContext *ctx)

{
  ParseContext *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  LogMessage *pLVar5;
  InternalMetadata **local_e0;
  ParseContext **local_d8;
  undefined1 *local_d0;
  ExtensionSet *local_c8;
  uint local_bc;
  ParseContext *pPStack_b8;
  uint32_t tag;
  ParseContext *ctx_local;
  InternalMetadata *metadata_local;
  Message *extendee_local;
  char *ptr_local;
  ExtensionSet *this_local;
  LogMessage local_88;
  Voidify local_71;
  Nullable<const_char_*> local_70;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  Voidify local_51;
  Nullable<const_char_*> local_50;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  int old_group_depth;
  int old_depth;
  uint local_34;
  Message *local_30;
  ParseContext *local_28;
  Message *local_20;
  Message *local_18;
  InternalMetadata ***local_10;
  
  pPStack_b8 = ctx;
  ctx_local = (ParseContext *)metadata;
  metadata_local = (InternalMetadata *)extendee;
  extendee_local = (Message *)ptr;
  ptr_local = (char *)this;
  do {
    while( true ) {
      bVar1 = ParseContext::Done(pPStack_b8,(char **)&extendee_local);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        return (char *)extendee_local;
      }
      extendee_local = (Message *)ReadTag((char *)extendee_local,&local_bc,0);
      this_00 = pPStack_b8;
      if (extendee_local == (Message *)0x0) {
        return (char *)0x0;
      }
      if (local_bc == 0xb) break;
      if ((local_bc == 0) || ((local_bc & 7) == 4)) {
        EpsCopyInputStream::SetLastTag(&pPStack_b8->super_EpsCopyInputStream,local_bc);
        return (char *)extendee_local;
      }
      extendee_local =
           (Message *)
           ParseField(this,(ulong)local_bc,(char *)extendee_local,(Message *)metadata_local,
                      (InternalMetadata *)ctx_local,pPStack_b8);
      if (extendee_local == (Message *)0x0) {
        return (char *)0x0;
      }
    }
    local_e0 = &metadata_local;
    local_d8 = &ctx_local;
    local_d0 = (undefined1 *)&stack0xffffffffffffff48;
    local_28 = pPStack_b8;
    local_34 = local_bc;
    _old_group_depth = &local_e0;
    iVar2 = pPStack_b8->depth_ + -1;
    pPStack_b8->depth_ = iVar2;
    local_c8 = this;
    local_30 = extendee_local;
    if (iVar2 < 0) {
      local_20 = (Message *)0x0;
    }
    else {
      pPStack_b8->group_depth_ = pPStack_b8->group_depth_ + 1;
      absl_log_internal_check_op_result._4_4_ = pPStack_b8->depth_;
      absl_log_internal_check_op_result._0_4_ = pPStack_b8->group_depth_;
      local_18 = extendee_local;
      local_10 = _old_group_depth;
      local_30 = (Message *)
                 ParseMessageSetItem(this,(char *)extendee_local,(Message *)metadata_local,
                                     (InternalMetadata *)ctx_local,pPStack_b8);
      if (local_30 != (Message *)0x0) {
        iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue
                          (absl_log_internal_check_op_result._4_4_);
        iVar3 = absl::lts_20250127::log_internal::GetReferenceableValue(this_00->depth_);
        local_50 = absl::lts_20250127::log_internal::Check_EQImpl(iVar2,iVar3,"old_depth == depth_")
        ;
        if (local_50 != (Nullable<const_char_*>)0x0) {
          pcVar4 = absl::lts_20250127::implicit_cast<char_const*>(local_50);
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&absl_log_internal_check_op_result_1,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                     ,0x491,pcVar4);
          pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                             ((LogMessage *)&absl_log_internal_check_op_result_1);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_51,pLVar5);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&absl_log_internal_check_op_result_1);
        }
        iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue
                          ((int)absl_log_internal_check_op_result);
        iVar3 = absl::lts_20250127::log_internal::GetReferenceableValue(this_00->group_depth_);
        local_70 = absl::lts_20250127::log_internal::Check_EQImpl
                             (iVar2,iVar3,"old_group_depth == group_depth_");
        if (local_70 != (Nullable<const_char_*>)0x0) {
          pcVar4 = absl::lts_20250127::implicit_cast<char_const*>(local_70);
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_88,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                     ,0x492,pcVar4);
          pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_88);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_71,pLVar5);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_88);
        }
        local_70 = (Nullable<const_char_*>)0x0;
      }
      this_00->group_depth_ = this_00->group_depth_ + -1;
      this_00->depth_ = this_00->depth_ + 1;
      bVar1 = EpsCopyInputStream::ConsumeEndGroup(&this_00->super_EpsCopyInputStream,local_34);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        local_20 = local_30;
      }
      else {
        local_20 = (Message *)0x0;
      }
    }
    extendee_local = local_20;
    if (local_20 == (Message *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* ParseMessageSet(const char* ptr, const Msg* extendee,
                              InternalMetadata* metadata,
                              internal::ParseContext* ctx) {
    while (!ctx->Done(&ptr)) {
      uint32_t tag;
      ptr = ReadTag(ptr, &tag);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      if (tag == WireFormatLite::kMessageSetItemStartTag) {
        ptr = ctx->ParseGroupInlined(ptr, tag, [&](const char* ptr) {
          return ParseMessageSetItem(ptr, extendee, metadata, ctx);
        });
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      } else {
        if (tag == 0 || (tag & 7) == 4) {
          ctx->SetLastTag(tag);
          return ptr;
        }
        ptr = ParseField(tag, ptr, extendee, metadata, ctx);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      }
    }
    return ptr;
  }